

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::AssertionHandler::handleUnexpectedInflightException(AssertionHandler *this)

{
  IResultCapture *pIVar1;
  int iVar2;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar3;
  undefined4 extraout_var;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  pIVar1 = this->m_resultCapture;
  pSVar3 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar2 = (*(pSVar3->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[5])(pSVar3);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
            (local_38,(long *)CONCAT44(extraout_var,iVar2));
  (*pIVar1->_vptr_IResultCapture[0xd])(pIVar1,this,local_38,&this->m_reaction);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

void AssertionHandler::handleUnexpectedInflightException() {
        m_resultCapture.handleUnexpectedInflightException( m_assertionInfo, Catch::translateActiveException(), m_reaction );
    }